

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O0

time_t time(time_t *__timer)

{
  int iVar1;
  undefined1 local_28 [8];
  timeval tv;
  time_t *timer_local;
  
  tv.tv_usec = (__suseconds_t)__timer;
  iVar1 = gettimeofday((timeval *)local_28,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    if (tv.tv_usec != 0) {
      *(undefined1 (*) [8])tv.tv_usec = local_28;
    }
    timer_local = (time_t *)local_28;
  }
  else {
    timer_local = (time_t *)0xffffffffffffffff;
  }
  return (time_t)timer_local;
}

Assistant:

time_t time( time_t * timer )
{
    struct timeval tv;

    if ( gettimeofday( &tv, NULL ) == 0 )
    {
        if ( timer != NULL )
        {
            *timer = tv.tv_sec;
        }

        return tv.tv_sec;
    }

    return -1;
}